

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printdfd.c
# Opt level: O0

char * dfdToStringDescriptorType(khr_df_khr_descriptortype_e value)

{
  khr_df_khr_descriptortype_e value_local;
  char *local_8;
  
  if (value == KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT) {
    local_8 = "KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT";
    return local_8;
  }
  if ((value != KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_WRITE_BIT) &&
     (value != KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_DECODE_BIT)) {
    if (value == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES) {
      local_8 = "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES";
      return local_8;
    }
    if (value == KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS) {
      local_8 = "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS";
      return local_8;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* dfdToStringDescriptorType(khr_df_khr_descriptortype_e value) {
    switch (value) {
    case KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT:
        return "KHR_DF_KHR_DESCRIPTORTYPE_BASICFORMAT";
    case KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES:
        return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_PLANES";
    case KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS:
        return "KHR_DF_KHR_DESCRIPTORTYPE_ADDITIONAL_DIMENSIONS";

    case KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_WRITE_BIT:
    case KHR_DF_KHR_DESCRIPTORTYPE_NEEDED_FOR_DECODE_BIT:
    case KHR_DF_KHR_DESCRIPTORTYPE_MAX:
        // These enum values are not meant for string representation. Ignore
        break;
    }
    return NULL;
}